

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.hpp
# Opt level: O3

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::getDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *dvType)

{
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  ulong uVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *pRVar6;
  long lVar7;
  StringHasher *pSVar8;
  
  if (dvType != (XMLCh *)0x0) {
    if (fBuiltInRegistry != 0) {
      uVar3 = (ulong)(ushort)*dvType;
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        XVar5 = dvType[1];
        if (XVar5 != L'\0') {
          pXVar4 = dvType + 2;
          do {
            uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
            XVar5 = *pXVar4;
            pXVar4 = pXVar4 + 1;
          } while (XVar5 != L'\0');
        }
        uVar3 = uVar3 % *(ulong *)(fBuiltInRegistry + 0x18);
      }
      lVar7 = *(long *)(*(long *)(fBuiltInRegistry + 0x10) + uVar3 * 8);
      if (lVar7 != 0) {
        pSVar8 = (StringHasher *)(fBuiltInRegistry + 0x30);
        do {
          bVar2 = StringHasher::equals(pSVar8,dvType,*(void **)(lVar7 + 0x10));
          if (bVar2) {
            uVar3 = (ulong)(ushort)*dvType;
            if (uVar3 == 0) {
              uVar3 = 0;
            }
            else {
              XVar5 = dvType[1];
              if (XVar5 != L'\0') {
                pXVar4 = dvType + 2;
                do {
                  uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
                  XVar5 = *pXVar4;
                  pXVar4 = pXVar4 + 1;
                } while (XVar5 != L'\0');
              }
              uVar3 = uVar3 % *(ulong *)(fBuiltInRegistry + 0x18);
            }
            pRVar6 = *(RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)
                      (*(long *)(fBuiltInRegistry + 0x10) + uVar3 * 8);
            if (pRVar6 == (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0) {
              return (DatatypeValidator *)0x0;
            }
            pSVar8 = (StringHasher *)(fBuiltInRegistry + 0x30);
            while (bVar2 = StringHasher::equals(pSVar8,dvType,pRVar6->fKey), !bVar2) {
              pRVar6 = pRVar6->fNext;
              if (pRVar6 == (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0) {
                return (DatatypeValidator *)0x0;
              }
            }
            goto LAB_002eb972;
          }
          lVar7 = *(long *)(lVar7 + 8);
        } while (lVar7 != 0);
      }
    }
    pRVar1 = this->fUserDefinedRegistry;
    if (pRVar1 != (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0)
    {
      uVar3 = (ulong)(ushort)*dvType;
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        XVar5 = dvType[1];
        if (XVar5 != L'\0') {
          pXVar4 = dvType + 2;
          do {
            uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
            XVar5 = *pXVar4;
            pXVar4 = pXVar4 + 1;
          } while (XVar5 != L'\0');
        }
        uVar3 = uVar3 % pRVar1->fHashModulus;
      }
      pRVar6 = pRVar1->fBucketList[uVar3];
      if (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0) {
        while (bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,dvType,pRVar6->fKey)
              , !bVar2) {
          pRVar6 = pRVar6->fNext;
          if (pRVar6 == (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0) {
            return (DatatypeValidator *)0x0;
          }
        }
        pRVar1 = this->fUserDefinedRegistry;
        uVar3 = (ulong)(ushort)*dvType;
        if (uVar3 == 0) {
          uVar3 = 0;
        }
        else {
          XVar5 = dvType[1];
          if (XVar5 != L'\0') {
            pXVar4 = dvType + 2;
            do {
              uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
              XVar5 = *pXVar4;
              pXVar4 = pXVar4 + 1;
            } while (XVar5 != L'\0');
          }
          uVar3 = uVar3 % pRVar1->fHashModulus;
        }
        pRVar6 = pRVar1->fBucketList[uVar3];
        if (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0) {
          while (bVar2 = StringHasher::equals
                                   ((StringHasher *)&pRVar1->field_0x30,dvType,pRVar6->fKey), !bVar2
                ) {
            pRVar6 = pRVar6->fNext;
            if (pRVar6 == (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0) {
              return (DatatypeValidator *)0x0;
            }
          }
LAB_002eb972:
          return pRVar6->fData;
        }
      }
    }
  }
  return (DatatypeValidator *)0x0;
}

Assistant:

inline DatatypeValidator*
DatatypeValidatorFactory::getDatatypeValidator(const XMLCh* const dvType) const
{
	if (dvType) {
        if (fBuiltInRegistry && fBuiltInRegistry->containsKey(dvType)) {
		    return fBuiltInRegistry->get(dvType);
        }

        if (fUserDefinedRegistry && fUserDefinedRegistry->containsKey(dvType)) {
		    return fUserDefinedRegistry->get(dvType);

        }
    }
	return 0;
}